

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void move(int *x,int *y,int dir)

{
  int dir_local;
  int *y_local;
  int *x_local;
  
  switch(dir) {
  case 0:
    *y = *y + -1;
    break;
  case 1:
    *x = *x + 1;
    break;
  case 2:
    *y = *y + 1;
    break;
  case 3:
    *x = *x + -1;
    break;
  default:
    panic("move: bad direction");
  }
  return;
}

Assistant:

static void move(int *x, int *y, int dir)
{
	switch(dir){
		case 0: --(*y); break;
		case 1: (*x)++; break;
		case 2: (*y)++; break;
		case 3: --(*x); break;
		default: panic("move: bad direction");
	}
}